

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skeletal_mesh.h
# Opt level: O3

void __thiscall SkeletalMesh::Scene::Scene(Scene *this)

{
  _Rb_tree_header *p_Var1;
  
  this->_vptr_Scene = (_func_int **)&PTR__Scene_0025b490;
  (this->name)._M_dataplus._M_p = (pointer)&(this->name).field_2;
  (this->name)._M_string_length = 0;
  (this->name).field_2._M_local_buf[0] = '\0';
  (this->filename)._M_dataplus._M_p = (pointer)&(this->filename).field_2;
  (this->filename)._M_string_length = 0;
  (this->filename).field_2._M_local_buf[0] = '\0';
  Assimp::Importer::Importer(&this->importer);
  p_Var1 = &(this->nameBoneMap)._M_t._M_impl.super__Rb_tree_header;
  (this->nameBoneMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->nameBoneMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->meshEntry).
  super__Vector_base<SkeletalMesh::MeshEntry,_std::allocator<SkeletalMesh::MeshEntry>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->meshEntry).
  super__Vector_base<SkeletalMesh::MeshEntry,_std::allocator<SkeletalMesh::MeshEntry>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->meshEntry).
  super__Vector_base<SkeletalMesh::MeshEntry,_std::allocator<SkeletalMesh::MeshEntry>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->material).
  super__Vector_base<SkeletalMesh::Material,_std::allocator<SkeletalMesh::Material>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->material).
  super__Vector_base<SkeletalMesh::Material,_std::allocator<SkeletalMesh::Material>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->material).
  super__Vector_base<SkeletalMesh::Material,_std::allocator<SkeletalMesh::Material>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->skeleton).super__Vector_base<SkeletalMesh::Bone,_std::allocator<SkeletalMesh::Bone>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->skeleton).super__Vector_base<SkeletalMesh::Bone,_std::allocator<SkeletalMesh::Bone>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->skeleton).super__Vector_base<SkeletalMesh::Bone,_std::allocator<SkeletalMesh::Bone>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->nameBoneMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->nameBoneMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->nameBoneMap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->available = false;
  this->vao = 0;
  this->vbo = 0;
  this->ebo = 0;
  return;
}

Assistant:

Scene() {
            available = false;
            vao = 0;
            vbo = 0;
            ebo = 0;
        }